

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# de.cpp
# Opt level: O1

string * de_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  long lVar1;
  
  lVar1 = 0;
  do {
    __s = getenv(*(char **)((long)&PTR_anon_var_dwarf_6a3be_00145a70 + lVar1));
    if (__s != (char *)0x0) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      strlen(__s);
      goto LAB_00121e7d;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x28);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
LAB_00121e7d:
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string de() {
  constexpr std::array<const char*, 5> env_vars = {
    "XDG_CURRENT_DESKTOP",
    "DESKTOP_SESSION",
    "XDG_SESSION_DESKTOP",
    "CURRENT_DESKTOP",
    "SESSION_DESKTOP"
  };

  for (const char* var : env_vars) {
    if (const char *desktop_session = std::getenv(var)) {
      return std::string(desktop_session);
    }
  }

  return "Unknown";
}